

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeDamped.cpp
# Opt level: O0

void __thiscall OpenMD::FluctuatingChargeDamped::moveA(FluctuatingChargeDamped *this)

{
  StuntDouble *in_RDI;
  RealType RVar1;
  RealType RVar2;
  StuntDouble *this_00;
  RealType cvel_00;
  RealType cmass;
  RealType cfrc;
  RealType cpos;
  RealType cvel;
  Atom *atom;
  Molecule *mol;
  FluctuatingChargeIterator j;
  MoleculeIterator i;
  iterator *in_stack_ffffffffffffffc8;
  SimInfo *in_stack_ffffffffffffffd0;
  Atom *local_28;
  Molecule *local_20;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_18;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_10 [2];
  
  if ((in_RDI->globalIndex_ & 1) != 0) {
    std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_10);
    __gnu_cxx::
    __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
    ::__normal_iterator(&local_18);
    local_20 = SimInfo::beginMolecule
                         (in_stack_ffffffffffffffd0,(MoleculeIterator *)in_stack_ffffffffffffffc8);
    while (local_20 != (Molecule *)0x0) {
      local_28 = Molecule::beginFluctuatingCharge
                           ((Molecule *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      while (local_28 != (Atom *)0x0) {
        RVar1 = StuntDouble::getFlucQVel(in_RDI);
        RVar2 = StuntDouble::getFlucQPos(in_RDI);
        this_00 = (StuntDouble *)StuntDouble::getFlucQFrc(in_RDI);
        cvel_00 = Atom::getChargeMass(local_28);
        in_stack_ffffffffffffffd0 =
             (SimInfo *)
             (((double)(in_RDI->properties_)._vptr_PropertyMap * (double)this_00) / cvel_00 + RVar1)
        ;
        in_stack_ffffffffffffffc8 =
             (iterator *)
             (*(double *)&(in_RDI->properties_).propMap_._M_t._M_impl *
              (double)in_stack_ffffffffffffffd0 + RVar2);
        StuntDouble::setFlucQVel(this_00,cvel_00);
        StuntDouble::setFlucQPos(this_00,cvel_00);
        local_28 = Molecule::nextFluctuatingCharge
                             ((Molecule *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      }
      local_20 = SimInfo::nextMolecule
                           (in_stack_ffffffffffffffd0,(MoleculeIterator *)in_stack_ffffffffffffffc8)
      ;
    }
  }
  return;
}

Assistant:

void FluctuatingChargeDamped::moveA() {
    if (!hasFlucQ_) return;

    SimInfo::MoleculeIterator i;
    Molecule::FluctuatingChargeIterator j;
    Molecule* mol;
    Atom* atom;
    RealType cvel, cpos, cfrc, cmass;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (atom = mol->beginFluctuatingCharge(j); atom != NULL;
           atom = mol->nextFluctuatingCharge(j)) {
        cvel  = atom->getFlucQVel();
        cpos  = atom->getFlucQPos();
        cfrc  = atom->getFlucQFrc();
        cmass = atom->getChargeMass();

        // velocity half step
        cvel += dt2_ * cfrc / cmass;
        // position whole step
        cpos += dt_ * cvel;

        atom->setFlucQVel(cvel);
        atom->setFlucQPos(cpos);
      }
    }
  }